

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvstore.cpp
# Opt level: O2

int KVStore::getLevel(string *path)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  
  std::__cxx11::string::find((char *)path,0x10b02a);
  std::__cxx11::string::substr((ulong)&s,(ulong)path);
  iVar1 = std::__cxx11::stoi(&s,(size_t *)0x0,10);
  std::__cxx11::string::~string((string *)&s);
  return iVar1;
}

Assistant:

int KVStore::getLevel(const string &path) {
  auto s = path.substr(path.find("level-") + 6);
  return stoi(s);
}